

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtmem.cpp
# Opt level: O1

Error asmjit::VirtMem::alloc(void **p,size_t size,uint32_t flags)

{
  uint __prot;
  void *pvVar1;
  uint uVar2;
  Error EVar3;
  
  *p = (void *)0x0;
  if (size == 0) {
    EVar3 = 2;
  }
  else {
    uVar2 = 3;
    if ((flags & 2) == 0) {
      uVar2 = flags & 1;
    }
    __prot = uVar2 | 5;
    if ((flags & 4) == 0) {
      __prot = uVar2;
    }
    EVar3 = 0;
    pvVar1 = mmap((void *)0x0,size,__prot,0x22,-1,0);
    if (pvVar1 == (void *)0xffffffffffffffff) {
      EVar3 = 1;
    }
    else {
      *p = pvVar1;
    }
  }
  return EVar3;
}

Assistant:

Error VirtMem::alloc(void** p, size_t size, uint32_t flags) noexcept {
  *p = nullptr;
  if (size == 0)
    return DebugUtils::errored(kErrorInvalidArgument);

  int protection = VirtMem_mmProtFromFlags(flags) | VirtMem_mmMaxProtFromFlags(flags);
  int mmFlags = MAP_PRIVATE | MAP_ANONYMOUS | VirtMem_mmMapJitFromFlags(flags);

  void* ptr = mmap(nullptr, size, protection, mmFlags, -1, 0);
  if (ptr == MAP_FAILED)
    return DebugUtils::errored(kErrorOutOfMemory);

  *p = ptr;
  return kErrorOk;
}